

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O3

bool __thiscall kj::_::expectExit(_ *this,Maybe<int> *statusCode,FunctionParam<void_()> code)

{
  __pid_t __pid;
  int iVar1;
  __pid_t _Var2;
  uint uVar3;
  uint uVar4;
  _ *p_Var5;
  bool bVar6;
  int status;
  DebugComparison<int,_int_&> _kjCondition;
  Fault f;
  uint local_5c;
  undefined1 local_58 [24];
  size_t local_40;
  bool local_38;
  Fault local_30;
  Maybe<int> *local_28;
  undefined8 local_20;
  
  local_20 = code.space._0_8_;
  local_28 = statusCode;
  do {
    __pid = fork();
    if (-1 < __pid) {
      if (__pid == 0) {
        (*(code *)statusCode->ptr)();
        _exit(0);
      }
      goto LAB_004b8b28;
    }
    iVar1 = Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
LAB_004b8b28:
    do {
      _Var2 = waitpid(__pid,(int *)&local_5c,0);
      if (-1 < _Var2) goto LAB_004b8b51;
      iVar1 = Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 == 0) {
LAB_004b8b51:
      uVar3 = local_5c & 0x7f;
      if (uVar3 == 0) {
        uVar3 = local_5c >> 8 & 0xff;
        if (*this == (_)0x1) {
          p_Var5 = this + 4;
          uVar4 = *(uint *)p_Var5;
          local_58._0_8_ = CONCAT44(local_58._4_4_,local_5c >> 8) & 0xffffffff000000ff;
          local_58._16_8_ = " == ";
          local_40 = 5;
          local_38 = uVar3 == uVar4;
          if ((!local_38) && (Debug::minSeverity < 3)) {
            local_58._8_8_ = p_Var5;
            Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int&>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x95,ERROR,
                       "\"failed: expected \" \"WEXITSTATUS(status) == s\", _kjCondition",
                       (char (*) [42])"failed: expected WEXITSTATUS(status) == s",
                       (DebugComparison<int,_int_&> *)local_58);
            uVar3 = local_5c >> 8 & 0xff;
            uVar4 = *(uint *)p_Var5;
          }
          bVar6 = uVar3 == uVar4;
        }
        else {
          local_58._4_4_ = 0;
          local_58._0_4_ = uVar3;
          local_58._8_8_ = " != ";
          local_58._16_8_ = &DAT_00000005;
          local_40 = CONCAT71(local_40._1_7_,uVar3 != 0);
          if ((uVar3 == 0) && (Debug::minSeverity < 3)) {
            Debug::log<char_const(&)[42],kj::_::DebugComparison<int,int>&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x98,ERROR,
                       "\"failed: expected \" \"WEXITSTATUS(status) != 0\", _kjCondition",
                       (char (*) [42])"failed: expected WEXITSTATUS(status) != 0",
                       (DebugComparison<int,_int> *)local_58);
          }
          bVar6 = (local_5c & 0xff00) != 0;
        }
      }
      else {
        if ((int)(uVar3 * 0x1000000 + 0x1000000) < 0x2000000) {
          if (Debug::minSeverity < 3) {
            Debug::log<char_const(&)[51],int&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                       ,0x9f,ERROR,
                       "\"subprocess didn\'t exit and didn\'t trigger a signal\", status",
                       (char (*) [51])"subprocess didn\'t exit and didn\'t trigger a signal",
                       (int *)&local_5c);
          }
        }
        else if (Debug::minSeverity < 3) {
          local_58._0_8_ = strsignal(uVar3);
          Debug::log<char_const(&)[46],char*>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                     ,0x9d,ERROR,
                     "\"subprocess didn\'t exit but triggered a signal\", strsignal(WTERMSIG(status))"
                     ,(char (*) [46])"subprocess didn\'t exit but triggered a signal",
                     (char **)local_58);
        }
        bVar6 = false;
      }
      return bVar6;
    }
    local_30.exception = (Exception *)0x0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = (int *)0x0;
    Debug::Fault::init(&local_30,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                      );
  }
  else {
    local_30.exception = (Exception *)0x0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = (int *)0x0;
    Debug::Fault::init(&local_30,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/test-helpers.c++"
                      );
  }
  Debug::Fault::fatal(&local_30);
}

Assistant:

bool expectExit(Maybe<int> statusCode, FunctionParam<void()> code)  noexcept {
#if _WIN32
  // We don't support death tests on Windows due to lack of efficient fork.
  return true;
#else
  pid_t child;
  KJ_SYSCALL(child = fork());
  if (child == 0) {
    code();
    _exit(0);
  }

  int status;
  KJ_SYSCALL(waitpid(child, &status, 0));

  if (WIFEXITED(status)) {
    KJ_IF_SOME(s, statusCode) {
      KJ_EXPECT(WEXITSTATUS(status) == s);
      return WEXITSTATUS(status) == s;
    } else {
      KJ_EXPECT(WEXITSTATUS(status) != 0);
      return WEXITSTATUS(status) != 0;
    }
  } else {
    if (WIFSIGNALED(status)) {
      KJ_FAIL_EXPECT("subprocess didn't exit but triggered a signal", strsignal(WTERMSIG(status)));
    } else {
      KJ_FAIL_EXPECT("subprocess didn't exit and didn't trigger a signal", status);
    }
    return false;
  }
#endif
}